

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinuxRawSocket.cpp
# Opt level: O1

bool __thiscall LinuxRawSocket::setOutputInterface(LinuxRawSocket *this,string *interface_name)

{
  int __fd;
  ifreq iface;
  char local_40 [16];
  int local_30;
  
  __fd = this->socket_fd;
  if (__fd != -1) {
    strcpy(local_40,(interface_name->_M_dataplus)._M_p);
    ioctl(__fd,0x8933,local_40);
    (this->output_interface).sll_ifindex = local_30;
  }
  return __fd != -1;
}

Assistant:

bool LinuxRawSocket::setOutputInterface(const std::string& interface_name)
{
    // Operation cannot complete successfully without an open socket
    if (socket_fd == -1)
    {
        return false;
    }

    // Retrieve the index of the desired interface
    output_interface.sll_ifindex = getInterfaceIndex(interface_name);

    return true;
}